

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

ulong __thiscall
CVmConstMapper::alloc_pool_space(CVmConstMapper *this,vm_obj_id_t obj_id,size_t len)

{
  void *pvVar1;
  ulong in_RDX;
  uint in_ESI;
  long in_RDI;
  ulong ret;
  undefined8 local_8;
  
  if (*(ulong *)(in_RDI + 8) < in_RDX) {
    local_8 = 0;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0x28) + (ulong)(in_ESI >> 10) * 8) == 0) {
      pvVar1 = malloc(0x2000);
      *(void **)(*(long *)(in_RDI + 0x28) + (ulong)(in_ESI >> 10) * 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0x28) + (ulong)(in_ESI >> 10) * 8) == 0) {
        err_throw(0);
      }
      memset(*(void **)(*(long *)(in_RDI + 0x28) + (ulong)(in_ESI >> 10) * 8),0,0x2000);
    }
    if (*(ulong *)(in_RDI + 0x20) < in_RDX) {
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x20) + *(long *)(in_RDI + 0x18);
      *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 8);
    }
    local_8 = *(ulong *)(in_RDI + 0x18);
    *(ulong *)(*(long *)(*(long *)(in_RDI + 0x28) + (ulong)(in_ESI >> 10) * 8) +
              (ulong)(in_ESI & 0x3ff) * 8) = local_8;
    *(ulong *)(in_RDI + 0x18) = in_RDX + *(long *)(in_RDI + 0x18);
    *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - in_RDX;
  }
  return local_8;
}

Assistant:

ulong CVmConstMapper::alloc_pool_space(vm_obj_id_t obj_id, size_t len)
{
    ulong ret;
    
    /* 
     *   if the data block is too large to fit on a constant pool page, we
     *   can't store it 
     */
    if (len > page_size_)
        return 0;
    
    /* if the translation page isn't mapped yet, map it */
    if (obj_addr_[obj_id / 1024] == 0)
    {
        /* allocate a new page */
        obj_addr_[obj_id / 1024] =
            (ulong *)t3malloc(1024 * sizeof(obj_addr_[0][0]));

        /* if that failed, throw an error */
        if (obj_addr_[obj_id / 1024] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* clear the new page */
        memset(obj_addr_[obj_id / 1024], 0, 1024 * sizeof(obj_addr_[0][0]));
    }

    /* if the block doesn't fit on this page, skip to the next page */
    if (len > rem_)
    {
        /* skip past the remainder of this page */
        next_free_ += rem_;

        /* we have the whole next page available now */
        rem_ = page_size_;
    }

    /* remember the object ID's address in the translation list */
    ret = obj_addr_[obj_id / 1024][obj_id % 1024] = next_free_;

    /* skip past the data */
    next_free_ += len;
    rem_ -= len;

    /* return the new address */
    return ret;
}